

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlibversion.cpp
# Opt level: O3

Version trun::TestLibVersion::FromVersion(version_t rawVersion)

{
  if (((uint)(rawVersion >> 0x18) & 0xff0000 | (uint)(byte)(rawVersion >> 0x38) |
       (uint)(rawVersion >> 8) & 0xff000000 | (uint)(rawVersion >> 0x28) & 0xff00) != 0x5f4b4e47) {
    FromVersion();
    rawVersion = 0x474e4b5f30313030;
  }
  return (Version)((rawVersion * 0x100 + 0xd000000000 & 0xff00000000 |
                   rawVersion * 0x1000000 + 0xd00000000000 & 0xff0000000000 |
                   (rawVersion << 0x28) + 0xd0000000000000 & 0xff000000000000 | rawVersion << 0x38)
                  + 0xd00000005f4b4e47);
}

Assistant:

Version TestLibVersion::FromVersion(version_t rawVersion) {
    Version version = {};

    // Check prefix...
    version.prefix[0] = ((rawVersion>>56) & 255);
    version.prefix[1] = ((rawVersion>>48) & 255);
    version.prefix[2] = ((rawVersion>>40) & 255);
    version.prefix[3] = ((rawVersion>>32) & 255);

    // Unknown version - return version 1
    if (memcmp(version.prefix, "GNK_", 4)) {
        fprintf(stderr,"ERR: wrong version prefix - reverting to V1 and trying (this can cause a crash)\n");
        return TestLibVersion::FromVersion(TRUN_MAGICAL_IF_VERSION1);
    }

#define ASCII_TO_NUM(x) ((x) - '0')

    version.data.ver.zero = ASCII_TO_NUM((rawVersion>>24) & 255);
    version.data.ver.major = ASCII_TO_NUM((rawVersion>>16) & 255);
    version.data.ver.minor = ASCII_TO_NUM((rawVersion>>8) & 255);
    version.data.ver.patch = ASCII_TO_NUM(rawVersion & 255);

#undef ASCII_TO_NUM
    return version;
}